

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asyn-thread.c
# Opt level: O0

_Bool init_resolve_thread(connectdata *conn,char *hostname,int port,addrinfo *hints)

{
  int iVar1;
  thread_data *td_00;
  char *pcVar2;
  pthread_t *ppVar3;
  int *piVar4;
  int local_3c;
  int err;
  thread_data *td;
  addrinfo *hints_local;
  int port_local;
  char *hostname_local;
  connectdata *conn_local;
  
  td_00 = (thread_data *)(*Curl_ccalloc)(1,0x90);
  local_3c = 0xc;
  (conn->async).os_specific = td_00;
  if (td_00 != (thread_data *)0x0) {
    (conn->async).port = port;
    (conn->async).field_0x28 = (conn->async).field_0x28 & 0xfe;
    (conn->async).status = 0;
    (conn->async).dns = (Curl_dns_entry *)0x0;
    td_00->thread_hnd = (pthread_t *)0x0;
    iVar1 = init_thread_sync_data(td_00,hostname,port,hints);
    if (iVar1 == 0) {
      (conn->async).os_specific = (void *)0x0;
      (*Curl_cfree)(td_00);
    }
    else {
      (*Curl_cfree)((conn->async).hostname);
      pcVar2 = (*Curl_cstrdup)(hostname);
      (conn->async).hostname = pcVar2;
      if ((conn->async).hostname != (char *)0x0) {
        (td_00->tsd).done = 0;
        ppVar3 = Curl_thread_create(getaddrinfo_thread,&td_00->tsd);
        td_00->thread_hnd = ppVar3;
        if (td_00->thread_hnd != (pthread_t *)0x0) {
          return true;
        }
        (td_00->tsd).done = 1;
        piVar4 = __errno_location();
        local_3c = *piVar4;
      }
      destroy_async_data(&conn->async);
    }
  }
  piVar4 = __errno_location();
  *piVar4 = local_3c;
  return false;
}

Assistant:

static bool init_resolve_thread(struct connectdata *conn,
                                const char *hostname, int port,
                                const struct addrinfo *hints)
{
  struct thread_data *td = calloc(1, sizeof(struct thread_data));
  int err = ENOMEM;

  conn->async.os_specific = (void *)td;
  if(!td)
    goto errno_exit;

  conn->async.port = port;
  conn->async.done = FALSE;
  conn->async.status = 0;
  conn->async.dns = NULL;
  td->thread_hnd = curl_thread_t_null;

  if(!init_thread_sync_data(td, hostname, port, hints)) {
    conn->async.os_specific = NULL;
    free(td);
    goto errno_exit;
  }

  free(conn->async.hostname);
  conn->async.hostname = strdup(hostname);
  if(!conn->async.hostname)
    goto err_exit;

  /* The thread will set this to 1 when complete. */
  td->tsd.done = 0;

#ifdef HAVE_GETADDRINFO
  td->thread_hnd = Curl_thread_create(getaddrinfo_thread, &td->tsd);
#else
  td->thread_hnd = Curl_thread_create(gethostbyname_thread, &td->tsd);
#endif

  if(!td->thread_hnd) {
    /* The thread never started, so mark it as done here for proper cleanup. */
    td->tsd.done = 1;
    err = errno;
    goto err_exit;
  }

  return TRUE;

 err_exit:
  destroy_async_data(&conn->async);

 errno_exit:
  errno = err;
  return FALSE;
}